

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bios.h
# Opt level: O2

int bios_string(envy_bios *bios,uint offs,char *res,int len)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((offs + len) - 1 < bios->length) {
    uVar2 = 0;
    uVar3 = 0;
    if (0 < len) {
      uVar3 = (ulong)(uint)len;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      res[uVar2] = bios->data[offs + (int)uVar2];
    }
    res[(uint)len] = '\0';
    iVar1 = 0;
  }
  else {
    fprintf(_stderr,"requested OOB string at 0x%04x len 0x%04x\n",offs);
    iVar1 = -0xe;
  }
  return iVar1;
}

Assistant:

static inline int bios_string(struct envy_bios *bios, unsigned int offs, char *res, int len) {
	if (offs+len-1 >= bios->length) {
		ENVY_BIOS_ERR("requested OOB string at 0x%04x len 0x%04x\n", offs, len);
		return -EFAULT;
	}
	int i;
	for (i = 0; i < len; i++)
		res[i] = bios->data[offs+i];
	res[len] = 0;
	return 0;
}